

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# errors.h
# Opt level: O0

void __thiscall
Potassco::ProgramOptions::DuplicateOption::DuplicateOption
          (DuplicateOption *this,string *ctx,string *key)

{
  string *in_RDX;
  ContextError *in_RSI;
  undefined8 *in_RDI;
  allocator local_39;
  string local_38 [8];
  string *in_stack_ffffffffffffffd0;
  string *in_stack_ffffffffffffffd8;
  Type in_stack_ffffffffffffffe4;
  
  std::allocator<char>::allocator();
  std::__cxx11::string::string(local_38,"",&local_39);
  ContextError::ContextError
            (in_RSI,in_RDX,in_stack_ffffffffffffffe4,in_stack_ffffffffffffffd8,
             in_stack_ffffffffffffffd0);
  std::__cxx11::string::~string(local_38);
  std::allocator<char>::~allocator((allocator<char> *)&local_39);
  *in_RDI = &PTR__DuplicateOption_0015c9e0;
  return;
}

Assistant:

DuplicateOption(const std::string& ctx, const std::string& key) : ContextError(ctx, ContextError::duplicate_option, key) {}